

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.h
# Opt level: O0

char * fmt::v11::detail::parse_precision<char>
                 (char *begin,char *end,format_specs *specs,arg_ref<char> *precision_ref,
                 parse_context<char> *ctx)

{
  char *in_RCX;
  basic_specs *in_RDX;
  long in_RSI;
  long in_RDI;
  parse_dynamic_spec_result<char> pVar1;
  parse_dynamic_spec_result<char> result;
  
  if (in_RDI + 1 == in_RSI) {
    report_error(in_RCX);
  }
  pVar1 = parse_dynamic_spec<char>
                    ((char *)specs,(char *)&precision_ref->index,(int *)ctx,
                     (arg_ref<char> *)result._8_8_,(parse_context<char> *)result.end);
  basic_specs::set_dynamic_precision(in_RDX,pVar1.kind);
  return pVar1.end;
}

Assistant:

FMT_CONSTEXPR auto parse_precision(const Char* begin, const Char* end,
                                   format_specs& specs,
                                   arg_ref<Char>& precision_ref,
                                   parse_context<Char>& ctx) -> const Char* {
  ++begin;
  if (begin == end) {
    report_error("invalid precision");
    return begin;
  }
  auto result =
      parse_dynamic_spec(begin, end, specs.precision, precision_ref, ctx);
  specs.set_dynamic_precision(result.kind);
  return result.end;
}